

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ReadTypedArray(BCReaderState *s)

{
  uint uVar1;
  JSContext *ctx;
  int iVar2;
  JSRefCountHeader *p;
  double dVar4;
  JSRefCountHeader *p_1;
  JSRuntime *rt;
  JSValue v;
  JSValue JVar5;
  uint8_t array_tag;
  uint32_t len;
  uint32_t offset;
  byte local_81;
  uint local_80;
  uint local_7c;
  ulong local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  int64_t local_60;
  double local_58;
  undefined8 local_50;
  double local_48;
  undefined8 local_40;
  JSValueUnion JVar3;
  
  ctx = s->ctx;
  iVar2 = bc_get_u8(s,&local_81);
  if (iVar2 != 0) goto LAB_0013c68b;
  if (8 < local_81) {
    JS_ThrowTypeError(ctx,"invalid typed array");
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  iVar2 = bc_get_leb128(s,&local_80);
  if ((iVar2 != 0) || (iVar2 = bc_get_leb128(s,&local_7c), iVar2 != 0)) goto LAB_0013c68b;
  uVar1 = s->objects_count;
  iVar2 = BC_add_object_ref1(s,(JSObject *)0x0);
  if (iVar2 != 0) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  JVar5 = JS_ReadObjectRec(s);
  JVar3 = JVar5.u;
  if ((JVar5.tag & 0xffffffffU) == 6) goto LAB_0013c68b;
  if (((uint)JVar5.tag == 0xffffffff) && ((ushort)(*(short *)((long)JVar3.ptr + 6) - 0x13U) < 2)) {
    if (*(long *)((long)JVar3.ptr + 0x30) == 0) goto LAB_0013c7f5;
    dVar4 = (double)(long)(int)local_7c;
    local_58 = (double)local_7c;
    if (-1 < (long)dVar4) {
      local_58 = dVar4;
    }
    local_50 = 7;
    if (-1 < (long)dVar4) {
      local_50 = 0;
    }
    dVar4 = (double)(long)(int)local_80;
    local_48 = (double)local_80;
    if (-1 < (long)dVar4) {
      local_48 = dVar4;
    }
    local_40 = 7;
    if (-1 < (long)dVar4) {
      local_40 = 0;
    }
    local_78 = JVar5.tag;
    local_70 = JVar3;
    _local_68 = JVar5;
    JVar5 = js_typed_array_constructor
                      (ctx,(JSValue)(ZEXT816(3) << 0x40),(int)local_50,(JSValue *)&local_68,
                       local_81 + 0x15);
    if ((int)JVar5.tag != 6) {
      if (0xffffff < *(uint *)&s->field_0x34) {
        *(JSValueUnion *)(s->objects + uVar1) = JVar5.u;
      }
      iVar2 = *local_70.ptr;
      *(int *)local_70.ptr = iVar2 + -1;
      if (1 < iVar2) {
        return JVar5;
      }
      v.tag = local_78;
      v.u.ptr = local_70.ptr;
      __JS_FreeValueRT(ctx->rt,v);
      return JVar5;
    }
    iVar2 = *local_70.ptr;
    *(int *)local_70.ptr = iVar2 + -1;
    if (1 < iVar2) goto LAB_0013c68b;
    rt = ctx->rt;
    JVar5.tag = local_78;
    JVar5.u.ptr = local_70.ptr;
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,0x13);
LAB_0013c7f5:
    if (((uint)JVar5.tag < 0xfffffff5) ||
       (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, 1 < iVar2)) goto LAB_0013c68b;
    rt = ctx->rt;
  }
  __JS_FreeValueRT(rt,JVar5);
LAB_0013c68b:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ReadTypedArray(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj = JS_UNDEFINED, array_buffer = JS_UNDEFINED;
    uint8_t array_tag;
    JSValueConst args[3];
    uint32_t offset, len, idx;
    
    if (bc_get_u8(s, &array_tag))
        return JS_EXCEPTION;
    if (array_tag >= JS_TYPED_ARRAY_COUNT)
        return JS_ThrowTypeError(ctx, "invalid typed array");
    if (bc_get_leb128(s, &len))
        return JS_EXCEPTION;
    if (bc_get_leb128(s, &offset))
        return JS_EXCEPTION;
    /* XXX: this hack could be avoided if the typed array could be
       created before the array buffer */
    idx = s->objects_count;
    if (BC_add_object_ref1(s, NULL))
        goto fail;
    array_buffer = JS_ReadObjectRec(s);
    if (JS_IsException(array_buffer))
        return JS_EXCEPTION;
    if (!js_get_array_buffer(ctx, array_buffer)) {
        JS_FreeValue(ctx, array_buffer);
        return JS_EXCEPTION;
    }
    args[0] = array_buffer;
    args[1] = JS_NewInt64(ctx, offset);
    args[2] = JS_NewInt64(ctx, len);
    obj = js_typed_array_constructor(ctx, JS_UNDEFINED,
                                     3, args,
                                     JS_CLASS_UINT8C_ARRAY + array_tag);
    if (JS_IsException(obj))
        goto fail;
    if (s->allow_reference) {
        s->objects[idx] = JS_VALUE_GET_OBJ(obj);
    }
    JS_FreeValue(ctx, array_buffer);
    return obj;
 fail:
    JS_FreeValue(ctx, array_buffer);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}